

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplePosRasterizationTest::iterate
          (SamplePosRasterizationTest *this)

{
  ostringstream *this_00;
  undefined8 uVar1;
  TestLog *log;
  RenderContext *context;
  TestContext *this_01;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  undefined4 extraout_var;
  RenderTarget *pRVar6;
  int triangleNdx;
  IterateResult IVar7;
  long lVar8;
  long lVar9;
  ScopedLogSection section;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  TriangleSceneSpec scene;
  int local_2d8;
  int local_2d4;
  Surface glSurface;
  Vec4 offset;
  undefined1 local_298 [8];
  size_type local_290;
  string local_278;
  string local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  SceneTriangle triangle;
  
  iVar5 = this->m_iteration;
  tcu::Surface::Surface(&glSurface,this->m_canvasSize,this->m_canvasSize);
  scene.triangles.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scene.triangles.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  scene.triangles.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((anonymous_namespace)::SamplePosRasterizationTest::drawSample(tcu::Surface&,int)::
      fullscreenQuad == '\0') {
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::SamplePosRasterizationTest::
                                 drawSample(tcu::Surface&,int)::fullscreenQuad);
    if (iVar3 != 0) {
      (anonymous_namespace)::SamplePosRasterizationTest::drawSample(tcu::Surface&,int)::
      fullscreenQuad._0_8_ = 0x3f800000bf800000;
      (anonymous_namespace)::SamplePosRasterizationTest::drawSample(tcu::Surface&,int)::
      fullscreenQuad._8_8_ = 0x3f80000000000000;
      (anonymous_namespace)::SamplePosRasterizationTest::drawSample(tcu::Surface&,int)::
      fullscreenQuad._16_8_ = 0xbf800000bf800000;
      (anonymous_namespace)::SamplePosRasterizationTest::drawSample(tcu::Surface&,int)::
      fullscreenQuad._24_8_ = 0x3f80000000000000;
      (anonymous_namespace)::SamplePosRasterizationTest::drawSample(tcu::Surface&,int)::
      fullscreenQuad._32_8_ = 0x3f8000003f800000;
      (anonymous_namespace)::SamplePosRasterizationTest::drawSample(tcu::Surface&,int)::
      fullscreenQuad._40_8_ = 0x3f80000000000000;
      (anonymous_namespace)::SamplePosRasterizationTest::drawSample(tcu::Surface&,int)::
      fullscreenQuad._48_8_ = 0xbf8000003f800000;
      (anonymous_namespace)::SamplePosRasterizationTest::drawSample(tcu::Surface&,int)::
      fullscreenQuad._56_8_ = 0x3f80000000000000;
      __cxa_guard_release(&(anonymous_namespace)::SamplePosRasterizationTest::
                           drawSample(tcu::Surface&,int)::fullscreenQuad);
    }
  }
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_2d4 = iVar5 + 1;
  de::toString<int>((string *)local_298,&local_2d4);
  std::operator+(&local_318,"Test sample position ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&offset,
                 &local_318,"/");
  de::toString<int>(&local_1d8,&this->m_samples);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&triangle,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&offset,
                 &local_1d8);
  local_2d8 = iVar5 + 1;
  de::toString<int>(&local_258,&local_2d8);
  std::operator+(&local_238,"Test sample position ",&local_258);
  std::operator+(&local_218,&local_238,"/");
  de::toString<int>(&local_278,&this->m_samples);
  std::operator+(&local_1f8,&local_218,&local_278);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&triangle,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&triangle);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&offset);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)local_298);
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar9 + 0xb8))(0x9100,this->m_texID);
  (**(code **)(lVar9 + 0xd8))(this->m_vaoID);
  (**(code **)(lVar9 + 0x40))(0x8892,this->m_vboID);
  (**(code **)(lVar9 + 0x150))
            (0x8892,0x40,
             (anonymous_namespace)::SamplePosRasterizationTest::drawSample(tcu::Surface&,int)::
             fullscreenQuad,0x88e4);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"bufferData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x1ee);
  (**(code **)(lVar9 + 0x1a00))(0,0,this->m_canvasSize);
  (**(code **)(lVar9 + 0x1c0))();
  (**(code **)(lVar9 + 0x188))(0x4000);
  (**(code **)(lVar9 + 0x19f0))(this->m_samplerProgramPosLoc,4,0x1406,0,0,0);
  (**(code **)(lVar9 + 0x610))(this->m_samplerProgramPosLoc);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"vertexAttribPointer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x1f5);
  (**(code **)(lVar9 + 0x1680))((this->m_samplerProgram->m_program).m_program);
  (**(code **)(lVar9 + 0x14f0))(this->m_samplerProgramSamplerLoc,0);
  (**(code **)(lVar9 + 0x14f0))(this->m_samplerProgramSampleNdxLoc,iVar5);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"useprogram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x1fa);
  triangle.positions[0].m_data._0_8_ =
       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(triangle.positions[0].m_data + 2);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Reading from texture with sample index ");
  std::ostream::operator<<(this_00,iVar5);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&triangle,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  (**(code **)(lVar9 + 0x538))(5,0,4);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"drawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x1ff);
  (**(code **)(lVar9 + 0x518))(this->m_samplerProgramPosLoc);
  (**(code **)(lVar9 + 0x1680))(0);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"cleanup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x203);
  (**(code **)(lVar9 + 0x648))();
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&triangle,&glSurface);
  glu::readPixels(context,0,0,(PixelBufferAccess *)&triangle);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"readPixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x207);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  uVar1 = *(undefined8 *)
           (this->m_samplePositions).
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar5].m_data;
  local_318._M_dataplus._M_p =
       (pointer)CONCAT44((float)((ulong)uVar1 >> 0x20) + -0.5,(float)uVar1 + -0.5);
  local_318._M_string_length = 0;
  local_298._0_4_ = (undefined4)this->m_canvasSize;
  local_290 = 0x3f8000003f800000;
  local_298._4_4_ = local_298._0_4_;
  tcu::operator/((tcu *)&triangle,(Vector<float,_4> *)&local_318,(Vector<float,_4> *)local_298);
  tcu::operator*((tcu *)&offset,2.0,triangle.positions);
  lVar9 = 0x20;
  for (lVar8 = 0;
      lVar8 < (int)(((long)(this->m_testTriangles).
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_testTriangles).
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x30); lVar8 = lVar8 + 1) {
    tcu::TriangleSceneSpec::SceneTriangle::SceneTriangle(&triangle);
    tcu::operator-((tcu *)&local_318,
                   (Vector<float,_4> *)
                   ((long)(&((this->m_testTriangles).
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
                             ._M_impl.super__Vector_impl_data._M_start)->p1 + -2) + lVar9),&offset);
    triangle.positions[0].m_data._0_8_ = local_318._M_dataplus._M_p;
    triangle.positions[0].m_data[2] = (float)(undefined4)local_318._M_string_length;
    triangle.positions[0].m_data[3] = (float)local_318._M_string_length._4_4_;
    tcu::operator-((tcu *)&local_318,
                   (Vector<float,_4> *)
                   ((long)(&((this->m_testTriangles).
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
                             ._M_impl.super__Vector_impl_data._M_start)->p1 + -1) + lVar9),&offset);
    triangle.positions[1].m_data._0_8_ = local_318._M_dataplus._M_p;
    triangle.positions[1].m_data[2] = (float)(undefined4)local_318._M_string_length;
    triangle.positions[1].m_data[3] = (float)local_318._M_string_length._4_4_;
    tcu::operator-((tcu *)&local_318,
                   (Vector<float,_4> *)
                   ((long)(((this->m_testTriangles).
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SamplePosRasterizationTest::Triangle>_>
                            ._M_impl.super__Vector_impl_data._M_start)->p1).m_data + lVar9),&offset)
    ;
    triangle.positions[2].m_data._0_8_ = local_318._M_dataplus._M_p;
    triangle.positions[2].m_data[2] = (float)(undefined4)local_318._M_string_length;
    triangle.positions[2].m_data[3] = (float)local_318._M_string_length._4_4_;
    triangle.sharedEdge[0] = false;
    triangle.sharedEdge[1] = false;
    triangle.sharedEdge[2] = false;
    std::
    vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
    ::push_back(&scene.triangles,&triangle);
    lVar9 = lVar9 + 0x30;
  }
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  triangle.positions[0].m_data[2] = (float)(pRVar6->m_pixelFormat).redBits;
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  triangle.positions[0].m_data[3] = (float)(pRVar6->m_pixelFormat).greenBits;
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  triangle.positions[1].m_data[0] = (float)(pRVar6->m_pixelFormat).blueBits;
  triangle.positions[0].m_data._0_8_ = (ulong)(uint)this->m_subpixelBits << 0x20;
  bVar2 = tcu::verifyTriangleGroupRasterization
                    (&glSurface,&scene,(RasterizationArguments *)&triangle,
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                     VERIFICATIONMODE_STRICT);
  std::
  _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::~_Vector_base((_Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   *)&scene);
  tcu::Surface::~Surface(&glSurface);
  bVar2 = (bool)(bVar2 & this->m_allIterationsOk);
  this->m_allIterationsOk = bVar2;
  iVar5 = this->m_iteration + 1;
  this->m_iteration = iVar5;
  if (iVar5 < this->m_samples) {
    IVar7 = CONTINUE;
  }
  else {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar2 == false) {
      tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_FAIL,"Pixel comparison failed");
      IVar7 = STOP;
    }
    else {
      IVar7 = STOP;
      tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_PASS,"Pass");
    }
  }
  return IVar7;
}

Assistant:

SamplePosRasterizationTest::IterateResult SamplePosRasterizationTest::iterate (void)
{
	m_allIterationsOk &= testMultisampleTexture(m_iteration);
	m_iteration++;

	if (m_iteration < m_samples)
		return CONTINUE;

	// End result
	if (m_allIterationsOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Pixel comparison failed");

	return STOP;
}